

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O3

spv_result_t spvtools::val::FirstBlockAssert(ValidationState_t *_,uint32_t target)

{
  bool bVar1;
  Function *pFVar2;
  Instruction *inst;
  BasicBlock *pBVar3;
  spv_result_t sVar4;
  string local_260;
  string local_240;
  string local_220;
  DiagnosticStream local_200;
  
  pFVar2 = ValidationState_t::current_function(_);
  bVar1 = Function::IsFirstBlock(pFVar2,target);
  sVar4 = SPV_SUCCESS;
  if (bVar1) {
    pFVar2 = ValidationState_t::current_function(_);
    inst = ValidationState_t::FindDef(_,pFVar2->id_);
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_CFG,inst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"First block ",0xc);
    ValidationState_t::getIdName_abi_cxx11_(&local_220,_,target);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200," of function ",0xd);
    pFVar2 = ValidationState_t::current_function(_);
    ValidationState_t::getIdName_abi_cxx11_(&local_240,_,pFVar2->id_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200," is targeted by block ",0x16);
    pFVar2 = ValidationState_t::current_function(_);
    pBVar3 = Function::current_block(pFVar2);
    ValidationState_t::getIdName_abi_cxx11_(&local_260,_,pBVar3->id_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_260._M_dataplus._M_p,local_260._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream(&local_200);
    sVar4 = local_200.error_;
  }
  return sVar4;
}

Assistant:

spv_result_t FirstBlockAssert(ValidationState_t& _, uint32_t target) {
  if (_.current_function().IsFirstBlock(target)) {
    return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(_.current_function().id()))
           << "First block " << _.getIdName(target) << " of function "
           << _.getIdName(_.current_function().id()) << " is targeted by block "
           << _.getIdName(_.current_function().current_block()->id());
  }
  return SPV_SUCCESS;
}